

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::ChompSetInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompSetInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  bool bVar1;
  Type pRVar2;
  
  pRVar2 = matcher->stats;
  if (pRVar2 != (Type)0x0) {
    pRVar2->numCompares = pRVar2->numCompares + 1;
  }
  while( true ) {
    if (pRVar2 != (Type)0x0) {
      pRVar2->numCompares = pRVar2->numCompares + 1;
    }
    if (inputLength <= *inputOffset) break;
    bVar1 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[*inputOffset]);
    if (!bVar1) break;
    *inputOffset = *inputOffset + 1;
    pRVar2 = matcher->stats;
  }
  *instPointer = *instPointer + 0x29;
  return false;
}

Assistant:

inline bool ChompSetInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && matchSet.Get(input[inputOffset])))
        {
            while(true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && matchSet.Get(input[inputOffset]))
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }